

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O2

wchar_t rd_monster_memory(void)

{
  bitflag *pbVar1;
  _Bool _Var2;
  int iVar3;
  char *message;
  monster_race *pmVar4;
  ulong uVar5;
  long lVar6;
  uint16_t nkill;
  uint16_t ntheft;
  char buf [128];
  
  rd_byte(&mflag_size);
  if (2 < mflag_size) {
    message = format("Too many (%u) monster temporary flags!");
    note(message);
    return L'\xffffffff';
  }
  lVar6 = 300;
  for (uVar5 = 1; (pmVar4 = r_info, z_info != (angband_constants *)0x0 && (uVar5 < z_info->r_max));
      uVar5 = uVar5 + 1) {
    pbVar1 = r_info->flags;
    r_info->flags[lVar6 + -0x28] = 'd';
    _Var2 = flag_has_dbg(pbVar1 + lVar6 + -0x5c,0xc,1,"race->flags","RF_UNIQUE");
    if (_Var2) {
      pmVar4->flags[lVar6 + -0x28] = '\x01';
    }
    lVar6 = lVar6 + 0xd0;
  }
  do {
    rd_string(buf,0x80);
    do {
      iVar3 = bcmp(buf,"No more monsters",0x11);
      if (iVar3 == 0) {
        return L'\0';
      }
      pmVar4 = lookup_monster(buf);
      rd_u16b(&nkill);
      rd_u16b(&ntheft);
    } while (pmVar4 == (monster_race *)0x0);
    l_list[pmVar4->ridx].pkills = nkill;
    _Var2 = flag_has_dbg(pmVar4->flags,0xc,1,"race->flags","RF_UNIQUE");
    if ((_Var2) && (nkill != 0)) {
      pmVar4->max_num = '\0';
    }
    l_list[pmVar4->ridx].thefts = ntheft;
  } while( true );
}

Assistant:

int rd_monster_memory(void)
{
	uint16_t nkill, ntheft;
	char buf[128];
	int i;

	/* Monster temporary flags */
	rd_byte(&mflag_size);

	/* Incompatible save files */
	if (mflag_size > MFLAG_SIZE) {
	        note(format("Too many (%u) monster temporary flags!", mflag_size));
		return (-1);
	}

	/* Reset maximum numbers per level */
	for (i = 1; z_info && i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];
		race->max_num = 100;
		if (rf_has(race->flags, RF_UNIQUE))
			race->max_num = 1;
	}

	rd_string(buf, sizeof(buf));
	while (!streq(buf, "No more monsters")) {
		struct monster_race *race = lookup_monster(buf);

		/* Get the kill and theft counts, skip if monster invalid */
		rd_u16b(&nkill);
		rd_u16b(&ntheft);
		if (!race) continue;

		/* Store the kill count, ensure dead uniques stay dead */
		l_list[race->ridx].pkills = nkill;
		if (rf_has(race->flags, RF_UNIQUE) && nkill)
			race->max_num = 0;

		/* Store the theft count */
		l_list[race->ridx].thefts = ntheft;

		/* Look for the next monster */
		rd_string(buf, sizeof(buf));
	}

	return 0;
}